

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QMakeParser::BlockScope>::resize_internal
          (QList<QMakeParser::BlockScope> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QMakeParser::BlockScope> *this_00;
  __off_t __length;
  QArrayDataPointer<QMakeParser::BlockScope> *in_RSI;
  QArrayDataPointer<QMakeParser::BlockScope> *in_RDI;
  QArrayDataPointer<QMakeParser::BlockScope> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QMakeParser::BlockScope> *this_01;
  QArrayDataPointer<QMakeParser::BlockScope> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QMakeParser::BlockScope> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QMakeParser::BlockScope> *__file;
  
  QArrayDataPointer<QMakeParser::BlockScope>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QMakeParser::BlockScope>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QMakeParser::BlockScope> *)
         capacity((QList<QMakeParser::BlockScope> *)0x317e81);
    qVar2 = QArrayDataPointer<QMakeParser::BlockScope>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QMakeParser::BlockScope> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QGenericArrayOps<QMakeParser::BlockScope> *)
                QArrayDataPointer<QMakeParser::BlockScope>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QMakeParser::BlockScope>::truncate
                (this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QMakeParser::BlockScope>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (BlockScope **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}